

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::Value::swap(Value *this,Value *other)

{
  CommentInfo *pCVar1;
  ptrdiff_t pVar2;
  
  swapPayload(this,other);
  pCVar1 = this->comments_;
  this->comments_ = other->comments_;
  other->comments_ = pCVar1;
  pVar2 = this->start_;
  this->start_ = other->start_;
  other->start_ = pVar2;
  pVar2 = this->limit_;
  this->limit_ = other->limit_;
  other->limit_ = pVar2;
  return;
}

Assistant:

void Value::swap(Value& other) {
  swapPayload(other);
  std::swap(comments_, other.comments_);
  std::swap(start_, other.start_);
  std::swap(limit_, other.limit_);
}